

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O0

void __thiscall AsyncRgbLedAnalyzer::AsyncRgbLedAnalyzer(AsyncRgbLedAnalyzer *this)

{
  AsyncRgbLedAnalyzerSettings *this_00;
  AsyncRgbLedAnalyzer *this_local;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__AsyncRgbLedAnalyzer_0011ac90;
  this_00 = (AsyncRgbLedAnalyzerSettings *)operator_new(0x50);
  AsyncRgbLedAnalyzerSettings::AsyncRgbLedAnalyzerSettings(this_00);
  std::unique_ptr<AsyncRgbLedAnalyzerSettings,std::default_delete<AsyncRgbLedAnalyzerSettings>>::
  unique_ptr<std::default_delete<AsyncRgbLedAnalyzerSettings>,void>
            ((unique_ptr<AsyncRgbLedAnalyzerSettings,std::default_delete<AsyncRgbLedAnalyzerSettings>>
              *)&this->mSettings,this_00);
  std::unique_ptr<AsyncRgbLedAnalyzerResults,std::default_delete<AsyncRgbLedAnalyzerResults>>::
  unique_ptr<std::default_delete<AsyncRgbLedAnalyzerResults>,void>
            ((unique_ptr<AsyncRgbLedAnalyzerResults,std::default_delete<AsyncRgbLedAnalyzerResults>>
              *)&this->mResults);
  this->mChannelData = (AnalyzerChannelData *)0x0;
  AsyncRgbLedSimulationDataGenerator::AsyncRgbLedSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mSimulationInitialized = false;
  this->mSampleRateHz = 0.0;
  this->mMinimumLowDurationSec = 0.0;
  this->mFirstBitAfterReset = false;
  this->mDidDetectHighSpeed = false;
  std::unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>::
  get(&this->mSettings);
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

AsyncRgbLedAnalyzer::AsyncRgbLedAnalyzer() : Analyzer2(), mSettings( new AsyncRgbLedAnalyzerSettings )
{
    SetAnalyzerSettings( mSettings.get() );
    UseFrameV2();
}